

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynBase * ParseTerminal(ParseContext *ctx)

{
  LexemeType LVar1;
  uint uVar2;
  Lexeme *begin;
  _func_int **pp_Var3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SynBase *pSVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  SynBase *pSVar6;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  SynNumber *pSVar7;
  SynNew *pSVar8;
  SynFunctionDefinition *pSVar9;
  SynShortFunctionDefinition *pSVar10;
  undefined4 extraout_var_10;
  char *pcVar11;
  undefined4 uVar12;
  undefined4 extraout_var_01;
  
  begin = ctx->currentLexeme;
  LVar1 = begin->type;
  if (0x16 < (int)LVar1) {
    if (0x4a < (int)LVar1) {
      if (LVar1 == lex_nullptr) {
        ctx->currentLexeme = begin + 1;
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pSVar6 = (SynBase *)CONCAT44(extraout_var_09,iVar4);
        if (ctx->firstLexeme < ctx->currentLexeme) {
          SynBase::SynBase(pSVar6,0x10,begin,ctx->currentLexeme + -1);
          pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f6a0;
          return pSVar6;
        }
      }
      else if (LVar1 == lex_false) {
        ctx->currentLexeme = begin + 1;
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pSVar6 = (SynBase *)CONCAT44(extraout_var_06,iVar4);
        if (ctx->firstLexeme < ctx->currentLexeme) {
          SynBase::SynBase(pSVar6,0xe,begin,ctx->currentLexeme + -1);
          pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f668;
          pSVar6->field_0x3a = 0;
          return pSVar6;
        }
      }
      else {
        if (LVar1 != lex_true) goto switchD_0011576f_caseD_5;
        ctx->currentLexeme = begin + 1;
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pSVar6 = (SynBase *)CONCAT44(extraout_var,iVar4);
        if (ctx->firstLexeme < ctx->currentLexeme) {
          SynBase::SynBase(pSVar6,0xe,begin,ctx->currentLexeme + -1);
          pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f668;
          pSVar6->field_0x3a = 1;
          return pSVar6;
        }
      }
      goto LAB_00115d03;
    }
    if (LVar1 == lex_bitand) {
      ctx->currentLexeme = begin + 1;
      pSVar6 = ParseComplexTerminal(ctx);
      if (pSVar6 == (SynBase *)0x0) {
        anon_unknown.dwarf_151f2::Report
                  (ctx,ctx->currentLexeme,"ERROR: variable not found after \'&\'");
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
        pSVar6 = (SynBase *)CONCAT44(extraout_var_07,iVar4);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00115d03;
        SynBase::SynBase(pSVar6,0,begin,ctx->currentLexeme + -1);
        pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f208;
      }
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pSVar5 = (SynBase *)CONCAT44(extraout_var_08,iVar4);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00115d03;
      SynBase::SynBase(pSVar5,0x1d,begin,ctx->currentLexeme + -1);
      pSVar5->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f6d8;
      goto LAB_00115abd;
    }
    if (LVar1 == lex_bitnot) {
      uVar12 = 3;
    }
    else {
      if (LVar1 != lex_lognot) goto switchD_0011576f_caseD_5;
      uVar12 = 4;
    }
    goto LAB_001159ee;
  }
  switch(LVar1) {
  case lex_semiquotedchar:
    pp_Var3 = (_func_int **)begin->pos;
    uVar2 = begin->length;
    ctx->currentLexeme = begin + 1;
    if (((ulong)uVar2 == 1) || (*(char *)((long)pp_Var3 + (ulong)(uVar2 - 1)) != '\'')) {
      pcVar11 = "ERROR: unclosed character constant";
LAB_00115d29:
      anon_unknown.dwarf_151f2::Stop(ctx,begin,pcVar11);
    }
    if (uVar2 < 4) {
      if (uVar2 != 3) {
        pcVar11 = "ERROR: empty character constant";
        goto LAB_00115d29;
      }
    }
    else if ((uVar2 != 4) || (*(char *)((long)pp_Var3 + 1) != '\\')) {
      pcVar11 = "ERROR: only one character can be inside single quotes";
      goto LAB_00115d29;
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pSVar6 = (SynBase *)CONCAT44(extraout_var_10,iVar4);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      SynBase::SynBase(pSVar6,0x11,begin,ctx->currentLexeme + -1);
      pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f710;
      pSVar6[1]._vptr_SynBase = pp_Var3;
      *(char **)&pSVar6[1].typeID = (char *)((long)pp_Var3 + (ulong)uVar2);
      return pSVar6;
    }
    break;
  default:
switchD_0011576f_caseD_5:
    pSVar7 = ParseNumber(ctx);
    if (pSVar7 != (SynNumber *)0x0) {
      return &pSVar7->super_SynBase;
    }
    pSVar8 = ParseNew(ctx);
    if (pSVar8 != (SynNew *)0x0) {
      return &pSVar8->super_SynBase;
    }
    pSVar6 = ParseSizeof(ctx);
    if (pSVar6 != (SynBase *)0x0) {
      return pSVar6;
    }
    pSVar9 = ParseFunctionDefinition(ctx);
    if (pSVar9 != (SynFunctionDefinition *)0x0) {
      return &pSVar9->super_SynBase;
    }
    pSVar10 = ParseShortFunctionDefinition(ctx);
    if (pSVar10 != (SynShortFunctionDefinition *)0x0) {
      return &pSVar10->super_SynBase;
    }
    pSVar6 = ParseComplexTerminal(ctx);
    return pSVar6;
  case lex_inc:
    ctx->currentLexeme = begin + 1;
    pSVar6 = ParseTerminal(ctx);
    if (pSVar6 == (SynBase *)0x0) {
      anon_unknown.dwarf_151f2::Report
                (ctx,ctx->currentLexeme,"ERROR: variable not found after \'++\'");
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
      pSVar6 = (SynBase *)CONCAT44(extraout_var_02,iVar4);
      if (ctx->currentLexeme <= ctx->firstLexeme) break;
      SynBase::SynBase(pSVar6,0,begin,ctx->currentLexeme + -1);
      pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f208;
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pSVar5 = (SynBase *)CONCAT44(extraout_var_03,iVar4);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      SynBase::SynBase(pSVar5,0x1b,begin,ctx->currentLexeme + -1);
      pSVar5->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f780;
      pSVar5[1]._vptr_SynBase = (_func_int **)pSVar6;
      *(undefined1 *)&pSVar5[1].typeID = 1;
      return pSVar5;
    }
    break;
  case lex_dec:
    ctx->currentLexeme = begin + 1;
    pSVar6 = ParseTerminal(ctx);
    if (pSVar6 == (SynBase *)0x0) {
      anon_unknown.dwarf_151f2::Report
                (ctx,ctx->currentLexeme,"ERROR: variable not found after \'--\'");
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
      pSVar6 = (SynBase *)CONCAT44(extraout_var_00,iVar4);
      if (ctx->currentLexeme <= ctx->firstLexeme) break;
      SynBase::SynBase(pSVar6,0,begin,ctx->currentLexeme + -1);
      pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f208;
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pSVar5 = (SynBase *)CONCAT44(extraout_var_01,iVar4);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      SynBase::SynBase(pSVar5,0x1b,begin,ctx->currentLexeme + -1);
      pSVar5->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f780;
      pSVar5[1]._vptr_SynBase = (_func_int **)pSVar6;
      *(undefined1 *)&pSVar5[1].typeID = 0;
      return pSVar5;
    }
    break;
  case lex_add:
    uVar12 = 1;
    goto LAB_001159ee;
  case lex_sub:
    uVar12 = 2;
LAB_001159ee:
    pcVar11 = begin->pos;
    uVar2 = begin->length;
    ctx->currentLexeme = begin + 1;
    pSVar6 = ParseTerminal(ctx);
    if (pSVar6 == (SynBase *)0x0) {
      anon_unknown.dwarf_151f2::Report
                (ctx,ctx->currentLexeme,"ERROR: expression not found after \'%.*s\'",(ulong)uVar2,
                 pcVar11);
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
      pSVar6 = (SynBase *)CONCAT44(extraout_var_04,iVar4);
      if (ctx->currentLexeme <= ctx->firstLexeme) break;
      SynBase::SynBase(pSVar6,0,begin,ctx->currentLexeme + -1);
      pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f208;
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pSVar5 = (SynBase *)CONCAT44(extraout_var_05,iVar4);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      SynBase::SynBase(pSVar5,0x2f,begin,ctx->currentLexeme + -1);
      pSVar5->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f748;
      *(undefined4 *)&pSVar5->field_0x3c = uVar12;
LAB_00115abd:
      pSVar5[1]._vptr_SynBase = (_func_int **)pSVar6;
      return pSVar5;
    }
  }
LAB_00115d03:
  __assert_fail("currentLexeme > firstLexeme",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0x19c,"Lexeme *ParseContext::Previous()");
}

Assistant:

SynBase* ParseTerminal(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_true))
		return new (ctx.get<SynBool>()) SynBool(start, ctx.Previous(), true);

	if(ctx.Consume(lex_false))
		return new (ctx.get<SynBool>()) SynBool(start, ctx.Previous(), false);

	if(ctx.Consume(lex_nullptr))
		return new (ctx.get<SynNullptr>()) SynNullptr(start, ctx.Previous());

	if(ctx.Consume(lex_bitand))
	{
		SynBase *node = ParseComplexTerminal(ctx);

		if(!node)
		{
			Report(ctx, ctx.Current(), "ERROR: variable not found after '&'");

			node = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		return new (ctx.get<SynGetAddress>()) SynGetAddress(start, ctx.Previous(), node);
	}

	if(ctx.At(lex_semiquotedchar))
	{
		InplaceStr str = ctx.Consume();

		if(str.length() == 1 || str.begin[str.length() - 1] != '\'')
			Stop(ctx, start, "ERROR: unclosed character constant");
		else if((str.length() > 3 && str.begin[1] != '\\') || str.length() > 4)
			Stop(ctx, start, "ERROR: only one character can be inside single quotes");
		else if(str.length() < 3)
			Stop(ctx, start, "ERROR: empty character constant");

		return new (ctx.get<SynCharacter>()) SynCharacter(start, ctx.Previous(), str);
	}

	if(SynUnaryOpType type = GetUnaryOpType(ctx.Peek()))
	{
		InplaceStr name = ctx.Consume();

		SynBase *value = ParseTerminal(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after '%.*s'", name.length(), name.begin);

			value = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		return new (ctx.get<SynUnaryOp>()) SynUnaryOp(start, ctx.Previous(), type, value);
	}

	if(ctx.Consume(lex_dec))
	{
		SynBase *value = ParseTerminal(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: variable not found after '--'");

			value = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		return new (ctx.get<SynPreModify>()) SynPreModify(start, ctx.Previous(), value, false);
	}

	if(ctx.Consume(lex_inc))
	{
		SynBase *value = ParseTerminal(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: variable not found after '++'");

			value = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		return new (ctx.get<SynPreModify>()) SynPreModify(start, ctx.Previous(), value, true);
	}

	if(SynNumber *node = ParseNumber(ctx))
		return node;

	if(SynNew *node = ParseNew(ctx))
		return node;

	if(SynBase *node = ParseSizeof(ctx))
		return node;

	if(SynBase *node = ParseFunctionDefinition(ctx))
		return node;

	if(SynBase *node = ParseShortFunctionDefinition(ctx))
		return node;

	if(SynBase *node = ParseComplexTerminal(ctx))
		return node;

	return NULL;
}